

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O3

void __thiscall mjs::regexp_object::fixup(regexp_object *this)

{
  gc_heap *this_00;
  
  this_00 = (this->super_native_object).super_object.heap_;
  if (*(int *)&(this->super_native_object).field_0x24 != 0) {
    gc_heap::register_fixup(this_00,(uint32_t *)&(this->super_native_object).field_0x24);
  }
  if ((this->source_).pos_ != 0) {
    gc_heap::register_fixup(this_00,&(this->source_).pos_);
  }
  value_representation::fixup(&this->last_index_,this_00);
  native_object::fixup(&this->super_native_object);
  return;
}

Assistant:

void fixup() {
        auto& h = heap();
        global_.fixup(h);
        source_.fixup(h);
        last_index_.fixup(h);
        native_object::fixup();
    }